

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DoOptimize(Fts3Table *p,int bReturnDone)

{
  bool bVar1;
  int iVar2;
  int local_3c;
  int local_30;
  int iLangid;
  int i;
  int rc2;
  sqlite3_stmt *pAllLangid;
  int local_18;
  int rc;
  int bSeenDone;
  int bReturnDone_local;
  Fts3Table *p_local;
  
  local_18 = 0;
  _i = (sqlite3_stmt *)0x0;
  rc = bReturnDone;
  _bSeenDone = p;
  pAllLangid._4_4_ = fts3SqlStmt(p,0x1b,(sqlite3_stmt **)&i,(sqlite3_value **)0x0);
  if (pAllLangid._4_4_ == 0) {
    sqlite3_bind_int(_i,1,_bSeenDone->iPrevLangid);
    sqlite3_bind_int(_i,2,_bSeenDone->nIndex);
    while (iVar2 = sqlite3_step(_i), iVar2 == 100) {
      iVar2 = sqlite3_column_int(_i,0);
      local_30 = 0;
      while( true ) {
        bVar1 = false;
        if (pAllLangid._4_4_ == 0) {
          bVar1 = local_30 < _bSeenDone->nIndex;
        }
        if (!bVar1) break;
        pAllLangid._4_4_ = fts3SegmentMerge(_bSeenDone,iVar2,local_30,-2);
        if (pAllLangid._4_4_ == 0x65) {
          local_18 = 1;
          pAllLangid._4_4_ = 0;
        }
        local_30 = local_30 + 1;
      }
    }
    iVar2 = sqlite3_reset(_i);
    if (pAllLangid._4_4_ == 0) {
      pAllLangid._4_4_ = iVar2;
    }
  }
  sqlite3Fts3SegmentsClose(_bSeenDone);
  sqlite3Fts3PendingTermsClear(_bSeenDone);
  if (((pAllLangid._4_4_ == 0) && (rc != 0)) && (local_18 != 0)) {
    local_3c = 0x65;
  }
  else {
    local_3c = pAllLangid._4_4_;
  }
  return local_3c;
}

Assistant:

static int fts3DoOptimize(Fts3Table *p, int bReturnDone){
  int bSeenDone = 0;
  int rc;
  sqlite3_stmt *pAllLangid = 0;

  rc = fts3SqlStmt(p, SQL_SELECT_ALL_LANGID, &pAllLangid, 0);
  if( rc==SQLITE_OK ){
    int rc2;
    sqlite3_bind_int(pAllLangid, 1, p->iPrevLangid);
    sqlite3_bind_int(pAllLangid, 2, p->nIndex);
    while( sqlite3_step(pAllLangid)==SQLITE_ROW ){
      int i;
      int iLangid = sqlite3_column_int(pAllLangid, 0);
      for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
        rc = fts3SegmentMerge(p, iLangid, i, FTS3_SEGCURSOR_ALL);
        if( rc==SQLITE_DONE ){
          bSeenDone = 1;
          rc = SQLITE_OK;
        }
      }
    }
    rc2 = sqlite3_reset(pAllLangid);
    if( rc==SQLITE_OK ) rc = rc2;
  }

  sqlite3Fts3SegmentsClose(p);
  sqlite3Fts3PendingTermsClear(p);

  return (rc==SQLITE_OK && bReturnDone && bSeenDone) ? SQLITE_DONE : rc;
}